

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

uint Catch::rngSeed(void)

{
  uint uVar1;
  Context *pCVar2;
  
  pCVar2 = getCurrentContext();
  uVar1 = (*pCVar2->m_config->_vptr_IConfig[0x11])();
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }